

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glob.cpp
# Opt level: O0

int __thiscall glob::glob::open(glob *this,char *__file,int __oflag,...)

{
  int extraout_EAX;
  char *__name;
  DIR *pDVar1;
  pointer pgVar2;
  undefined1 local_58 [8];
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  dir_and_file;
  string *pattern_local;
  glob *this_local;
  
  dir_and_file.second.field_2._8_8_ = __file;
  anon_unknown_2::split_path
            ((pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              *)local_58,(string *)__file);
  __name = (char *)std::__cxx11::string::c_str();
  pDVar1 = opendir(__name);
  pgVar2 = std::unique_ptr<glob::glob_impl,_std::default_delete<glob::glob_impl>_>::operator->
                     (&this->impl_);
  pgVar2->dir = (DIR *)pDVar1;
  pgVar2 = std::unique_ptr<glob::glob_impl,_std::default_delete<glob::glob_impl>_>::operator->
                     (&this->impl_);
  std::__cxx11::string::operator=
            ((string *)pgVar2,(string *)(dir_and_file.first.field_2._M_local_buf + 8));
  pgVar2 = std::unique_ptr<glob::glob_impl,_std::default_delete<glob::glob_impl>_>::operator->
                     (&this->impl_);
  if (pgVar2->dir != (DIR *)0x0) {
    next(this);
  }
  std::
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::~pair((pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
           *)local_58);
  return extraout_EAX;
}

Assistant:

void glob::open(const std::string &pattern) {
    auto dir_and_file = split_path(pattern);
    impl_->dir = opendir(dir_and_file.first.c_str());
    impl_->file_pattern = dir_and_file.second;

    if (impl_->dir != nullptr) {
        next();
    }
}